

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::CheckVersionFile
          (cmFindPackageCommand *this,string *version_file,string *result_version)

{
  cmMakefile *pcVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  string *psVar6;
  string_view value;
  byte local_4c3;
  byte local_4c2;
  allocator<char> local_3c1;
  string local_3c0;
  uint local_39c;
  uint local_398;
  uint parsed_tweak;
  uint parsed_patch;
  uint parsed_minor;
  uint parsed_major;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  byte local_312;
  allocator<char> local_311;
  undefined1 local_310 [6];
  bool unsuitable;
  byte local_2ea;
  byte local_2e9;
  bool okay;
  size_t sStack_2e8;
  bool suitable;
  char *pcStack_2e0;
  allocator<char> local_2c9;
  string local_2c8;
  size_t local_2a8;
  char *pcStack_2a0;
  allocator<char> local_289;
  string local_288;
  string_view local_268;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_208;
  allocator<char> local_1e1;
  string local_1e0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_1c0;
  allocator<char> local_199;
  string local_198;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_178;
  anon_class_8_1_8991fb9c local_158;
  anon_class_8_1_8991fb9c addDefinition;
  allocator<char> local_139;
  string local_138;
  string_view local_118;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  PolicyPushPop local_30;
  PolicyPushPop polScope;
  ScopePushPop varScope;
  string *result_version_local;
  string *version_file_local;
  cmFindPackageCommand *this_local;
  
  cmMakefile::ScopePushPop::ScopePushPop
            ((ScopePushPop *)&polScope,(this->super_cmFindCommon).Makefile);
  cmMakefile::PolicyPushPop::PolicyPushPop(&local_30,(this->super_cmFindCommon).Makefile);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"PACKAGE_VERSION",&local_61);
  cmMakefile::RemoveDefinition(pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"PACKAGE_VERSION_UNSUITABLE",&local_89);
  cmMakefile::RemoveDefinition(pcVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"PACKAGE_VERSION_COMPATIBLE",&local_b1);
  cmMakefile::RemoveDefinition(pcVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"PACKAGE_VERSION_EXACT",&local_d9);
  cmMakefile::RemoveDefinition(pcVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"PACKAGE_FIND_NAME",&local_101);
  local_118 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Name);
  cmMakefile::AddDefinition(pcVar1,&local_100,local_118);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"PACKAGE_FIND_VERSION_COMPLETE",&local_139);
  value = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->VersionComplete)
  ;
  addDefinition.this = (cmFindPackageCommand *)value._M_len;
  cmMakefile::AddDefinition(pcVar1,&local_138,value);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  local_158.this = this;
  std::
  function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>::
  function<cmFindPackageCommand::CheckVersionFile(std::__cxx11::string_const&,std::__cxx11::string&)::__0&,void>
            ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_178,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"PACKAGE_FIND_VERSION",&local_199);
  SetVersionVariables(this,&local_178,&local_198,&this->Version,this->VersionCount,
                      this->VersionMajor,this->VersionMinor,this->VersionPatch,this->VersionTweak);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_178);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::CheckVersionFile(std::__cxx11::string_const&,std::__cxx11::string&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)&local_1c0,&local_158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"PACKAGE_FIND_VERSION_MIN",&local_1e1);
    SetVersionVariables(this,&local_1c0,&local_1e0,&this->Version,this->VersionCount,
                        this->VersionMajor,this->VersionMinor,this->VersionPatch,this->VersionTweak)
    ;
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function(&local_1c0);
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::CheckVersionFile(std::__cxx11::string_const&,std::__cxx11::string&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)&local_208,&local_158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"PACKAGE_FIND_VERSION_MAX",&local_229);
    SetVersionVariables(this,&local_208,&local_228,&this->VersionMax,this->VersionMaxCount,
                        this->VersionMaxMajor,this->VersionMaxMinor,this->VersionMaxPatch,
                        this->VersionMaxTweak);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function(&local_208);
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"PACKAGE_FIND_VERSION_RANGE",&local_251);
    local_268 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->VersionComplete);
    cmMakefile::AddDefinition(pcVar1,&local_250,local_268);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"PACKAGE_FIND_VERSION_RANGE_MIN",&local_289);
    local_2a8 = (this->VersionRangeMin)._M_len;
    pcStack_2a0 = (this->VersionRangeMin)._M_str;
    cmMakefile::AddDefinition(pcVar1,&local_288,this->VersionRangeMin);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"PACKAGE_FIND_VERSION_RANGE_MAX",&local_2c9);
    sStack_2e8 = (this->VersionRangeMax)._M_len;
    pcStack_2e0 = (this->VersionRangeMax)._M_str;
    cmMakefile::AddDefinition(pcVar1,&local_2c8,this->VersionRangeMax);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
  }
  local_2e9 = 0;
  bVar3 = ReadListFile(this,version_file,NoPolicyScope);
  if (bVar3) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_310,"PACKAGE_VERSION_EXACT",&local_311);
    bVar3 = cmMakefile::IsOn(pcVar1,(string *)local_310);
    std::__cxx11::string::~string((string *)local_310);
    std::allocator<char>::~allocator(&local_311);
    pcVar1 = (this->super_cmFindCommon).Makefile;
    local_2ea = bVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"PACKAGE_VERSION_UNSUITABLE",&local_339);
    bVar3 = cmMakefile::IsOn(pcVar1,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    local_312 = bVar3;
    if (((local_2ea & 1) == 0) && ((this->VersionExact & 1U) == 0)) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"PACKAGE_VERSION_COMPATIBLE",&local_361);
      local_2ea = cmMakefile::IsOn(pcVar1,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator(&local_361);
    }
    local_4c2 = 0;
    if ((local_312 & 1) == 0) {
      local_4c3 = 1;
      if ((local_2ea & 1) == 0) {
        local_4c3 = std::__cxx11::string::empty();
      }
      local_4c2 = local_4c3;
    }
    local_2e9 = local_4c2 & 1;
    if (local_2e9 != 0) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parsed_major,"PACKAGE_VERSION",
                 (allocator<char> *)((long)&parsed_minor + 3));
      psVar6 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&parsed_major);
      std::__cxx11::string::operator=((string *)&this->VersionFound,(string *)psVar6);
      std::__cxx11::string::~string((string *)&parsed_major);
      std::allocator<char>::~allocator((allocator<char> *)((long)&parsed_minor + 3));
      uVar4 = anon_unknown.dwarf_ad0985::parseVersion
                        (&this->VersionFound,&parsed_patch,&parsed_tweak,&local_398,&local_39c);
      this->VersionFoundCount = uVar4;
      switch(this->VersionFoundCount) {
      case 4:
        this->VersionFoundTweak = local_39c;
      case 3:
        this->VersionFoundPatch = local_398;
      case 2:
        this->VersionFoundMinor = parsed_tweak;
      case 1:
        this->VersionFoundMajor = parsed_patch;
      }
    }
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"PACKAGE_VERSION",&local_3c1);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_3c0);
  std::__cxx11::string::operator=((string *)result_version,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::string::operator=((string *)result_version,"unknown");
  }
  bVar2 = local_2e9;
  cmMakefile::PolicyPushPop::~PolicyPushPop(&local_30);
  cmMakefile::ScopePushPop::~ScopePushPop((ScopePushPop *)&polScope);
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmFindPackageCommand::CheckVersionFile(std::string const& version_file,
                                            std::string& result_version)
{
  // The version file will be loaded in an isolated scope.
  cmMakefile::ScopePushPop const varScope(this->Makefile);
  cmMakefile::PolicyPushPop const polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  // Clear the output variables.
  this->Makefile->RemoveDefinition("PACKAGE_VERSION");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_UNSUITABLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_COMPATIBLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_EXACT");

  // Set the input variables.
  this->Makefile->AddDefinition("PACKAGE_FIND_NAME", this->Name);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_COMPLETE",
                                this->VersionComplete);

  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->Makefile->AddDefinition(variable, value);
  };
  this->SetVersionVariables(addDefinition, "PACKAGE_FIND_VERSION",
                            this->Version, this->VersionCount,
                            this->VersionMajor, this->VersionMinor,
                            this->VersionPatch, this->VersionTweak);
  if (!this->VersionRange.empty()) {
    this->SetVersionVariables(addDefinition, "PACKAGE_FIND_VERSION_MIN",
                              this->Version, this->VersionCount,
                              this->VersionMajor, this->VersionMinor,
                              this->VersionPatch, this->VersionTweak);
    this->SetVersionVariables(addDefinition, "PACKAGE_FIND_VERSION_MAX",
                              this->VersionMax, this->VersionMaxCount,
                              this->VersionMaxMajor, this->VersionMaxMinor,
                              this->VersionMaxPatch, this->VersionMaxTweak);

    this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_RANGE",
                                  this->VersionComplete);
    this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_RANGE_MIN",
                                  this->VersionRangeMin);
    this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_RANGE_MAX",
                                  this->VersionRangeMax);
  }

  // Load the version check file.  Pass NoPolicyScope because we do
  // our own policy push/pop independent of CMP0011.
  bool suitable = false;
  if (this->ReadListFile(version_file, NoPolicyScope)) {
    // Check the output variables.
    bool okay = this->Makefile->IsOn("PACKAGE_VERSION_EXACT");
    bool const unsuitable = this->Makefile->IsOn("PACKAGE_VERSION_UNSUITABLE");
    if (!okay && !this->VersionExact) {
      okay = this->Makefile->IsOn("PACKAGE_VERSION_COMPATIBLE");
    }

    // The package is suitable if the version is okay and not
    // explicitly unsuitable.
    suitable = !unsuitable && (okay || this->Version.empty());
    if (suitable) {
      // Get the version found.
      this->VersionFound =
        this->Makefile->GetSafeDefinition("PACKAGE_VERSION");

      // Try to parse the version number and store the results that were
      // successfully parsed.
      unsigned int parsed_major;
      unsigned int parsed_minor;
      unsigned int parsed_patch;
      unsigned int parsed_tweak;
      this->VersionFoundCount =
        parseVersion(this->VersionFound, parsed_major, parsed_minor,
                     parsed_patch, parsed_tweak);
      switch (this->VersionFoundCount) {
        case 4:
          this->VersionFoundTweak = parsed_tweak;
          CM_FALLTHROUGH;
        case 3:
          this->VersionFoundPatch = parsed_patch;
          CM_FALLTHROUGH;
        case 2:
          this->VersionFoundMinor = parsed_minor;
          CM_FALLTHROUGH;
        case 1:
          this->VersionFoundMajor = parsed_major;
          CM_FALLTHROUGH;
        default:
          break;
      }
    }
  }

  result_version = this->Makefile->GetSafeDefinition("PACKAGE_VERSION");
  if (result_version.empty()) {
    result_version = "unknown";
  }

  // Succeed if the version is suitable.
  return suitable;
}